

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.h
# Opt level: O0

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>::TPZGeoBlend
          (TPZGeoBlend<pzgeom::TPZGeoPoint> *this,void **vtt)

{
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  TPZGeoElSideIndex *in_stack_ffffffffffffff60;
  void **in_stack_ffffffffffffff68;
  TPZGeoPoint *in_stack_ffffffffffffff70;
  TPZTransform<double> *in_stack_ffffffffffffff80;
  undefined8 *local_58;
  undefined8 *local_28;
  
  TPZGeoPoint::TPZGeoPoint(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  *in_RDI = *in_RSI;
  local_28 = in_RDI + 3;
  do {
    TPZGeoElSideIndex::TPZGeoElSideIndex(in_stack_ffffffffffffff60);
    local_28 = local_28 + 3;
  } while (local_28 != in_RDI + 6);
  local_58 = in_RDI + 6;
  do {
    TPZTransform<double>::TPZTransform(in_stack_ffffffffffffff80);
    local_58 = local_58 + 0x34;
  } while (local_58 != in_RDI + 0x3a);
  return;
}

Assistant:

TPZGeoBlend() : TPZRegisterClassId(&TPZGeoBlend::ClassId),
                        TGeo() {
        }